

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

void ob_q_free(nghttp2_outbound_queue *q,nghttp2_mem *mem)

{
  nghttp2_outbound_item *pnVar1;
  nghttp2_outbound_item *item;
  
  item = q->head;
  while (item != (nghttp2_outbound_item *)0x0) {
    pnVar1 = item->qnext;
    nghttp2_outbound_item_free(item,mem);
    nghttp2_mem_free(mem,item);
    item = pnVar1;
  }
  return;
}

Assistant:

static void ob_q_free(nghttp2_outbound_queue *q, nghttp2_mem *mem) {
  nghttp2_outbound_item *item, *next;
  for (item = q->head; item;) {
    next = item->qnext;
    nghttp2_outbound_item_free(item, mem);
    nghttp2_mem_free(mem, item);
    item = next;
  }
}